

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

lu_mem propagatemark(global_State *g)

{
  lua_State *th;
  int iVar1;
  GCObject **ppGVar2;
  GCObject *o;
  global_State *g_local;
  
  th = (lua_State *)g->gray;
  th->marked = th->marked | 0x20;
  ppGVar2 = getgclist((GCObject *)th);
  g->gray = *ppGVar2;
  switch(th->tt) {
  case '\x05':
    g_local = (global_State *)traversetable(g,(Table *)th);
    break;
  case '\x06':
    iVar1 = traverseLclosure(g,(LClosure *)th);
    g_local = (global_State *)(long)iVar1;
    break;
  case '\a':
    iVar1 = traverseudata(g,(Udata *)th);
    g_local = (global_State *)(long)iVar1;
    break;
  case '\b':
    iVar1 = traversethread(g,th);
    g_local = (global_State *)(long)iVar1;
    break;
  default:
    g_local = (global_State *)0x0;
    break;
  case '\n':
    iVar1 = traverseproto(g,(Proto *)th);
    g_local = (global_State *)(long)iVar1;
    break;
  case '&':
    iVar1 = traverseCclosure(g,(CClosure *)th);
    g_local = (global_State *)(long)iVar1;
  }
  return (lu_mem)g_local;
}

Assistant:

static lu_mem propagatemark (global_State *g) {
  GCObject *o = g->gray;
  nw2black(o);
  g->gray = *getgclist(o);  /* remove from 'gray' list */
  switch (o->tt) {
    case LUA_VTABLE: return traversetable(g, gco2t(o));
    case LUA_VUSERDATA: return traverseudata(g, gco2u(o));
    case LUA_VLCL: return traverseLclosure(g, gco2lcl(o));
    case LUA_VCCL: return traverseCclosure(g, gco2ccl(o));
    case LUA_VPROTO: return traverseproto(g, gco2p(o));
    case LUA_VTHREAD: return traversethread(g, gco2th(o));
    default: lua_assert(0); return 0;
  }
}